

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool __thiscall
el::Configurations::hasConfiguration(Configurations *this,ConfigurationType configurationType)

{
  bool result;
  EnumType lIndex;
  ConfigurationType configurationType_local;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  lIndex = 2;
  result = false;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  configurationType_local = configurationType;
  local_28._M_unused._M_object = operator_new(0x20);
  *(Configurations **)local_28._M_unused._0_8_ = this;
  *(EnumType **)((long)local_28._M_unused._0_8_ + 8) = &lIndex;
  *(ConfigurationType **)((long)local_28._M_unused._0_8_ + 0x10) = &configurationType_local;
  *(bool **)((long)local_28._M_unused._0_8_ + 0x18) = &result;
  pcStack_10 = base::utils::std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NwnUtilLib/easylogging++.cc:243:38)>
               ::_M_invoke;
  local_18 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NwnUtilLib/easylogging++.cc:243:38)>
             ::_M_manager;
  LevelHelper::forEachLevel(&lIndex,(function<bool_()> *)&local_28);
  base::utils::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return result;
}

Assistant:

bool Configurations::hasConfiguration(ConfigurationType configurationType) {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  bool result = false;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    if (hasConfiguration(LevelHelper::castFromInt(lIndex), configurationType)) {
      result = true;
    }
    return result;
  });
  return result;
}